

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O2

string * __thiscall
flatbuffers::BaseGenerator::LastNamespacePart_abi_cxx11_
          (string *__return_storage_ptr__,BaseGenerator *this,Namespace *ns)

{
  allocator<char> local_9;
  
  if (*(long *)this == *(long *)(this + 8)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_9)
    ;
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)(*(long *)(this + 8) + -0x20));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BaseGenerator::LastNamespacePart(const Namespace &ns) {
  if (!ns.components.empty())
    return ns.components.back();
  else
    return std::string("");
}